

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void __thiscall
wallet::wallet_tests::scan_for_wallet_transactions::test_method(scan_for_wallet_transactions *this)

{
  int *piVar1;
  undefined1 auVar2 [16];
  pointer ppCVar3;
  Chain *pCVar4;
  pointer ppCVar5;
  uint256 *puVar6;
  ChainstateManager *pCVar7;
  MockableData records;
  MockableData records_00;
  MockableData records_01;
  MockableData records_02;
  void *pvVar8;
  undefined1 auVar9 [16];
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> uVar10;
  bool bVar11;
  readonly_property65 rVar12;
  Chainstate *pCVar13;
  CBlockFileInfo *pCVar14;
  uchar *puVar15;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar16;
  anon_enum_32 aVar17;
  iterator pvVar18;
  char *pcVar19;
  WalletRescanReserver *pWVar20;
  iterator pvVar21;
  CBlockIndex *pCVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  initializer_list<int> __l;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  initializer_list<int> __l_00;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  check_type cVar34;
  undefined8 in_stack_fffffffffffff3e8;
  undefined8 in_stack_fffffffffffff3f0;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar31;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CBlockIndex *pCVar32;
  undefined8 in_stack_fffffffffffff408;
  CBlockIndex *pCVar33;
  CKey *this_00;
  undefined1 *local_be0;
  undefined1 *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  undefined1 *local_bb0;
  undefined1 *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  undefined1 *local_b80;
  undefined1 *local_b78;
  char *local_b70;
  char *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  char *local_b50;
  char *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  char *local_b30;
  char *local_b28;
  long *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  char *local_ac8;
  char *local_ac0;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  undefined1 *local_a98;
  undefined1 *local_a90;
  char *local_a88;
  char *local_a80;
  long *local_a78;
  char *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  undefined1 *local_a30;
  undefined1 *local_a28;
  char *local_a20;
  char *local_a18;
  assertion_result local_a10;
  char *local_9f8;
  char *local_9f0;
  undefined1 *local_9e8;
  undefined1 *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 *local_998;
  undefined1 *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  _Any_data local_8f8;
  code *local_8e8;
  code *pcStack_8e0;
  time_point fake_time;
  element_type *local_8c8;
  shared_count local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  long *local_7f0;
  undefined1 local_7e8 [8];
  assertion_result local_7e0;
  char *local_7c8;
  uint256 *local_7c0;
  CBlockLocator locator_1;
  ScanResult *local_790;
  char *local_788;
  assertion_result local_780;
  WalletRescanReserver reserver;
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  CBlockLocator locator;
  assertion_result *paStack_690;
  undefined1 local_678 [8];
  bool bStack_670;
  uchar uStack_66f;
  uchar uStack_66e;
  uchar uStack_66d;
  uchar uStack_66c;
  uchar uStack_66b;
  uchar uStack_66a;
  uchar uStack_669;
  shared_count sStack_668;
  char *pcStack_660;
  ScanResult result;
  uchar local_60c [4];
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  CWallet wallet;
  CBlock local_128 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar31 = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar31,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x4e,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar31,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x4e,"operator()","m_node.chainman");
  wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
  wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&wallet);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((puVar31->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar3 = (pCVar13->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (pCVar13->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar22 = (CBlockIndex *)0x0;
  }
  else {
    pCVar22 = ppCVar3[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&wallet)
  ;
  wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
  wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&wallet);
  pCVar14 = ::node::BlockManager::GetBlockFileInfo
                      (&((puVar31->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                        m_blockman,
                       (long)(int)(-(uint)((pCVar22->nStatus & 8) == 0) | pCVar22->nFile));
  pCVar14->nSize = 0x8000000;
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&wallet)
  ;
  reserver.m_wallet = (CWallet *)0x0;
  reserver.m_could_reserve = false;
  reserver._9_7_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = reserver.m_now.super__Function_base._M_functor._8_8_;
  reserver.m_now.super__Function_base._M_functor = (_Any_data)(auVar2 << 0x40);
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  CKey::GetPubKey((CPubKey *)&wallet,this_00);
  GetScriptForRawPubKey((CScript *)&result,(CPubKey *)&wallet);
  TestChain100Setup::CreateAndProcessBlock
            (local_128,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&reserver,
             (CScript *)&result,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_128[0].vtx);
  if (0x1c < (uint)result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._24_4_) {
    free((void *)result._0_8_);
    result.status = SUCCESS;
    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&reserver);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar31,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x51,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar31,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x51,"operator()","m_node.chainman");
  wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
  wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&wallet);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((puVar31->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar3 = (pCVar13->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (pCVar13->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar32 = (CBlockIndex *)0x0;
  }
  else {
    pCVar32 = ppCVar3[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&wallet)
  ;
  pCVar4 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  result._0_8_ = result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"");
  local_608 = (undefined1  [16])0x0;
  local_5f8._8_8_ = 0;
  local_5f8._0_8_ = local_608 + 8;
  local_5f8 = local_5f8 << 0x40;
  local_5e8._8_8_ = 0;
  local_5e8._0_8_ = local_608 + 8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_fffffffffffff3f0;
  records._M_t._M_impl._0_8_ = in_stack_fffffffffffff3e8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pCVar32;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff408;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00;
  CreateMockableWalletDatabase((wallet *)&local_7f0,records);
  CWallet::CWallet(&wallet,pCVar4,(string *)&result,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_7f0);
  if (local_7f0 != (long *)0x0) {
    (**(code **)(*local_7f0 + 8))();
  }
  local_7f0 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
               *)local_608);
  if ((uchar *)result._0_8_ != result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc
     ) {
    operator_delete((void *)result._0_8_,
                    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ + 1);
  }
  result._0_8_ = &wallet.cs_wallet;
  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&result);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar31,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x58,"test_method","m_node.chainman");
  reserver._0_9_ = ZEXT89(0x13bf540);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&reserver);
  CWallet::SetWalletFlag(&wallet,0x400000000);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((puVar31->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar3 = (pCVar13->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar5 = (pCVar13->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((puVar31->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar6 = (pCVar13->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->phashBlock;
  if (puVar6 != (uint256 *)0x0) {
    wallet.m_last_block_processed_height = (int)((ulong)((long)ppCVar3 - (long)ppCVar5) >> 3) + -1;
    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar6->super_base_blob<256U>).m_data._M_elems;
    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&reserver);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&result);
    AddKey(&wallet,this_00);
    pWVar20 = &reserver;
    reserver.m_could_reserve = false;
    reserver.m_wallet = &wallet;
    reserver.m_now.super__Function_base._M_functor = (_Any_data)0x0;
    reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
    reserver.m_now._M_invoker = (_Invoker_type)0x0;
    WalletRescanReserver::reserve(pWVar20,false);
    stack0xfffffffffffff968 = (undefined1  [16])0x0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pvVar18 = (iterator)0x0;
    CWallet::ScanForWalletTransactions
              (&result,&wallet,(uint256 *)&locator,0,(optional<int>)0x0,pWVar20,false,false);
    local_800 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_7f8 = "";
    local_810 = &boost::unit_test::basic_cstring<char_const>::null;
    local_808 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x60;
    file.m_begin = (iterator)&local_800;
    msg.m_end = (iterator)pWVar20;
    msg.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_810,msg);
    local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
    local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
    local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_7c8 = "";
    local_7c0 = (uint256 *)local_7e8;
    local_678[0] = result.status == FAILURE;
    local_7e8._0_4_ = 1;
    bStack_670 = false;
    uStack_66f = '\0';
    uStack_66e = '\0';
    uStack_66d = '\0';
    uStack_66c = '\0';
    uStack_66b = '\0';
    uStack_66a = '\0';
    uStack_669 = '\0';
    sStack_668.pi_ = (sp_counted_base *)0x0;
    local_780._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_780.m_message.px = (element_type *)0xf86ba8;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013b2fb8;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0xb8;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._1_7_ = 0x13b2f;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar18 = (iterator)0x1;
    pvVar21 = (iterator)0x2;
    local_790 = &result;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf86bc6,
               (size_t)&local_780,0x60,(uint256 *)&locator,"CWallet::ScanResult::FAILURE",&locator_1
              );
    boost::detail::shared_count::~shared_count(&sStack_668);
    local_820 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_818 = "";
    local_830 = &boost::unit_test::basic_cstring<char_const>::null;
    local_828 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x61;
    file_00.m_begin = (iterator)&local_820;
    msg_00.m_end = pvVar21;
    msg_00.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_830,
               msg_00);
    _cVar34 = 0x8078cb;
    puVar15 = std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (&result.last_failed_block,local_60c);
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = puVar15 == local_60c;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7e0._0_8_ = "result.last_failed_block.IsNull()";
    local_7e0.m_message.px = (element_type *)0xf86c12;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_840 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_838 = "";
    pvVar18 = (iterator)0x1;
    pvVar21 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,_cVar34,
               (size_t)&local_840,0x61);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_850 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_848 = "";
    local_860 = &boost::unit_test::basic_cstring<char_const>::null;
    local_858 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x62;
    file_01.m_begin = (iterator)&local_850;
    msg_01.m_end = pvVar21;
    msg_01.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_860,
               msg_01);
    _cVar34 = 0x8079ae;
    puVar15 = std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (&result.last_scanned_block,&result.last_scanned_height);
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (optional<int> *)puVar15 == &result.last_scanned_height
    ;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7e0._0_8_ = "result.last_scanned_block.IsNull()";
    local_7e0.m_message.px = (element_type *)0xf86c35;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_870 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_868 = "";
    pvVar18 = (iterator)0x1;
    pvVar21 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,_cVar34,
               (size_t)&local_870,0x62);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_880 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_878 = "";
    local_890 = &boost::unit_test::basic_cstring<char_const>::null;
    local_888 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar34 = 0x807a79;
    file_02.m_end = (iterator)0x63;
    file_02.m_begin = (iterator)&local_880;
    msg_02.m_end = pvVar21;
    msg_02.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_890,
               msg_02);
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         result.last_scanned_height.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_engaged ^ 1;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7e0._0_8_ = "!result.last_scanned_height";
    local_7e0.m_message.px = (element_type *)0xf86c51;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
    paStack_690 = &local_7e0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_8a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_898 = "";
    pvVar18 = (iterator)0x1;
    pvVar21 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,_cVar34,
               (size_t)&local_8a0,99);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_8b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_8a8 = "";
    local_8c0.pi_ = (sp_counted_base *)&boost::unit_test::basic_cstring<char_const>::null;
    local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x64;
    file_03.m_begin = (iterator)&local_8b0;
    msg_03.m_end = pvVar21;
    msg_03.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_8c0,
               msg_03);
    bStack_670 = false;
    local_678 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
    sStack_668.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pcStack_660 = "";
    GetBalance((Balance *)&locator,&wallet,0,true);
    local_7c0 = (uint256 *)
                &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0);
    local_7e8 = (undefined1  [8])&fake_time;
    fake_time.__d.__r = (duration)((ulong)fake_time.__d.__r._4_4_ << 0x20);
    local_780.m_message.px = (element_type *)0x0;
    local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_790 = (ScanResult *)0xf86b3c;
    local_788 = "";
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0xd0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._1_7_ = 0x13abe;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
    local_7e0._0_8_ = &PTR__lazy_ostream_013abcf0;
    local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_7c8 = local_7e8;
    pvVar18 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_780,(lazy_ostream *)local_678,1,2,REQUIRE,0xf86c52,(size_t)&local_790,100,
               (assertion_result *)&locator_1,"0",&local_7e0);
    boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
    WalletRescanReserver::~WalletRescanReserver(&reserver);
    CWallet::~CWallet(&wallet);
    pCVar4 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chain._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    result._0_8_ = result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc;
    std::__cxx11::string::_M_construct<char_const*>((string *)&result,"");
    local_6d8 = (undefined1  [16])0x0;
    local_6c8._8_8_ = 0;
    local_6c8._0_8_ = local_6d8 + 8;
    local_6c8 = local_6c8 << 0x40;
    local_6b8._8_8_ = 0;
    local_6b8._0_8_ = local_6d8 + 8;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar31;
    records_00._M_t._M_impl._0_8_ = in_stack_fffffffffffff3e8;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pCVar32;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pCVar22;
    records_00._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00;
    CreateMockableWalletDatabase((wallet *)&local_8c8,records_00);
    CWallet::CWallet(&wallet,pCVar4,(string *)&result,
                     (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                      )&local_8c8);
    if (local_8c8 != (element_type *)0x0) {
      (*(local_8c8->m_stream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        [1])();
    }
    local_8c8 = (element_type *)0x0;
    std::
    _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                 *)local_6d8);
    if ((uchar *)result._0_8_ !=
        result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc) {
      operator_delete((void *)result._0_8_,
                      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ + 1);
    }
    result._0_8_ = &wallet.cs_wallet;
    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&result);
    pcVar19 = "m_node.chainman";
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (puVar31,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
               ,0x6d,"test_method","m_node.chainman");
    reserver._0_9_ = ZEXT89(0x13bf540);
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&reserver);
    CWallet::SetWalletFlag(&wallet,0x400000000);
    pCVar13 = ChainstateManager::ActiveChainstate
                        ((puVar31->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar3 = (pCVar13->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppCVar5 = (pCVar13->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar13 = ChainstateManager::ActiveChainstate
                        ((puVar31->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar6 = (pCVar13->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar6 != (uint256 *)0x0) {
      wallet.m_last_block_processed_height = (int)((ulong)((long)ppCVar3 - (long)ppCVar5) >> 3) + -1
      ;
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar6->super_base_blob<256U>).m_data._M_elems;
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&reserver);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&result);
      AddKey(&wallet,this_00);
      reserver.m_could_reserve = false;
      reserver.m_wallet = &wallet;
      reserver.m_now.super__Function_base._M_functor = (_Any_data)0x0;
      reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
      reserver.m_now._M_invoker = (_Invoker_type)0x0;
      fake_time.__d.__r = (duration)0;
      local_8f8._8_8_ = 0;
      local_8f8._M_unused._M_object = &fake_time;
      pcStack_8e0 = std::
                    _Function_handler<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:116:25)>
                    ::_M_invoke;
      local_8e8 = std::
                  _Function_handler<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:116:25)>
                  ::_M_manager;
      std::
      function<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_()>
      ::operator=(&reserver.m_now,
                  (function<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_()>
                   *)&local_8f8);
      if (local_8e8 != (code *)0x0) {
        (*local_8e8)(&local_8f8,&local_8f8,__destroy_functor);
      }
      WalletRescanReserver::reserve(&reserver,false);
      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = paStack_690;
      stack0xfffffffffffff968 = auVar9 << 0x40;
      local_908 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_900 = "";
      local_918 = &boost::unit_test::basic_cstring<char_const>::null;
      local_910 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x79;
      file_04.m_begin = (iterator)&local_908;
      msg_04.m_end = pvVar18;
      msg_04.m_begin = pcVar19;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_918,
                 msg_04);
      uVar10 = wallet.m_database;
      if ((__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
          wallet.m_database._M_t.
          super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
          ._M_t.
          super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
          .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)0x0
         ) {
LAB_00809f76:
        __assert_fail("static_cast<bool>(m_database)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                      ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
      }
      (**(code **)(*(long *)wallet.m_database._M_t.
                            super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                            .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl +
                  0x70))(&local_7e0,
                         wallet.m_database._M_t.
                         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl,1);
      local_7e0.m_message.px =
           (element_type *)
           uVar10._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      _cVar34 = 0x807fc4;
      bVar11 = WalletBatch::ReadBestBlock((WalletBatch *)&local_7e0,&locator);
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = !bVar11;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_678 = (undefined1  [8])0xf86c75;
      bStack_670 = true;
      uStack_66f = 'l';
      uStack_66e = 0xf8;
      uStack_66d = '\0';
      uStack_66c = '\0';
      uStack_66b = '\0';
      uStack_66a = '\0';
      uStack_669 = '\0';
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      result._0_8_ = &PTR__lazy_ostream_013abc70;
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_928 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_920 = "";
      pvVar18 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._20_8_ =
           (lazy_ostream *)local_678;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&locator_1,(lazy_ostream *)&result,1,0,WARN,_cVar34,
                 (size_t)&local_928,0x79);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if ((undefined **)local_7e0._0_8_ != (undefined **)0x0) {
        (**(code **)(*(undefined **)local_7e0._0_8_ + 0x28))();
      }
      local_938 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_930 = "";
      local_948 = &boost::unit_test::basic_cstring<char_const>::null;
      local_940 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar34 = 0x8080a0;
      file_05.m_end = (iterator)0x7a;
      file_05.m_begin = (iterator)&local_938;
      msg_05.m_end = pvVar21;
      msg_05.m_begin = pvVar18;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_948,
                 msg_05);
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ =
           locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start ==
           locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_7e0._0_8_ = "locator.IsNull()";
      local_7e0.m_message.px = (element_type *)0xf86d28;
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      result._0_8_ = &PTR__lazy_ostream_013abc70;
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_958 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_950 = "";
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._20_8_ = &local_7e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&locator_1,(lazy_ostream *)&result,1,0,WARN,_cVar34,
                 (size_t)&local_958,0x7a);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pCVar33 = pCVar22;
      if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      puVar6 = pCVar22->phashBlock;
      if (puVar6 != (uint256 *)0x0) {
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._0_16_ =
             *(undefined1 (*) [16])(puVar6->super_base_blob<256U>).m_data._M_elems;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
        pWVar20 = &reserver;
        pvVar18 = (iterator)0x0;
        CWallet::ScanForWalletTransactions
                  (&result,&wallet,(uint256 *)&locator,pCVar22->nHeight,(optional<int>)0x0,pWVar20,
                   false,true);
        local_968 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_960 = "";
        local_978 = &boost::unit_test::basic_cstring<char_const>::null;
        local_970 = &boost::unit_test::basic_cstring<char_const>::null;
        file_06.m_end = (iterator)0x7e;
        file_06.m_begin = (iterator)&local_968;
        msg_06.m_end = (iterator)pWVar20;
        msg_06.m_begin = pvVar18;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_978
                   ,msg_06);
        local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
        local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
        local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_7c8 = "";
        local_678[0] = result.status == SUCCESS;
        local_7e8 = (undefined1  [8])((ulong)local_7e8 & 0xffffffff00000000);
        bStack_670 = false;
        uStack_66f = '\0';
        uStack_66e = '\0';
        uStack_66d = '\0';
        uStack_66c = '\0';
        uStack_66b = '\0';
        uStack_66a = '\0';
        uStack_669 = '\0';
        sStack_668.pi_ = (sp_counted_base *)0x0;
        local_780._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_780.m_message.px = (element_type *)0xf86ba8;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013b2fb8;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        local_7c0 = (uint256 *)local_7e8;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 0xb8;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start._1_7_ = 0x13b2f;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        pvVar18 = (iterator)0x1;
        pvVar21 = (iterator)0x2;
        local_790 = &result;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf86bc6,
                   (size_t)&local_780,0x7e,(uint256 *)&locator,"CWallet::ScanResult::SUCCESS",
                   (assertion_result *)&locator_1);
        boost::detail::shared_count::~shared_count(&sStack_668);
        local_988 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_980 = "";
        local_998 = &boost::unit_test::basic_cstring<char_const>::null;
        local_990 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0x7f;
        file_07.m_begin = (iterator)&local_988;
        msg_07.m_end = pvVar21;
        msg_07.m_begin = pvVar18;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_998
                   ,msg_07);
        _cVar34 = 0x808366;
        puVar15 = std::
                  __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                            (&result.last_failed_block,local_60c);
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = puVar15 == local_60c;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._1_7_ = 0;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_7e0._0_8_ = "result.last_failed_block.IsNull()";
        local_7e0.m_message.px = (element_type *)0xf86c12;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
        paStack_690 = &local_7e0;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        local_9a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_9a0 = "";
        pvVar18 = (iterator)0x1;
        pvVar21 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,_cVar34,
                   (size_t)&local_9a8,0x7f);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        local_9b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_9b0 = "";
        local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_08.m_end = (iterator)0x80;
        file_08.m_begin = (iterator)&local_9b8;
        msg_08.m_end = pvVar21;
        msg_08.m_begin = pvVar18;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_9c8
                   ,msg_08);
        local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
        local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
        local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_7c8 = "";
        puVar6 = pCVar32->phashBlock;
        if (puVar6 != (uint256 *)0x0) {
          local_678 = *(undefined1 (*) [8])(puVar6->super_base_blob<256U>).m_data._M_elems;
          bStack_670 = (bool)(puVar6->super_base_blob<256U>).m_data._M_elems[8];
          uStack_66f = (puVar6->super_base_blob<256U>).m_data._M_elems[9];
          uStack_66e = (puVar6->super_base_blob<256U>).m_data._M_elems[10];
          uStack_66d = (puVar6->super_base_blob<256U>).m_data._M_elems[0xb];
          uStack_66c = (puVar6->super_base_blob<256U>).m_data._M_elems[0xc];
          uStack_66b = (puVar6->super_base_blob<256U>).m_data._M_elems[0xd];
          uStack_66a = (puVar6->super_base_blob<256U>).m_data._M_elems[0xe];
          uStack_669 = (puVar6->super_base_blob<256U>).m_data._M_elems[0xf];
          auVar2 = *(undefined1 (*) [16])((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
          sStack_668.pi_ = auVar2._0_8_;
          pcStack_660 = auVar2._8_8_;
          auVar27[0] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x10] ==
                        auVar2[0]);
          auVar27[1] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x11] ==
                        auVar2[1]);
          auVar27[2] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x12] ==
                        auVar2[2]);
          auVar27[3] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x13] ==
                        auVar2[3]);
          auVar27[4] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x14] ==
                        auVar2[4]);
          auVar27[5] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x15] ==
                        auVar2[5]);
          auVar27[6] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x16] ==
                        auVar2[6]);
          auVar27[7] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x17] ==
                        auVar2[7]);
          auVar27[8] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x18] ==
                        auVar2[8]);
          auVar27[9] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x19] ==
                        auVar2[9]);
          auVar27[10] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                         auVar2[10]);
          auVar27[0xb] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                          auVar2[0xb]);
          auVar27[0xc] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                          auVar2[0xc]);
          auVar27[0xd] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                          auVar2[0xd]);
          auVar27[0xe] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                          auVar2[0xe]);
          auVar27[0xf] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                          auVar2[0xf]);
          auVar23[0] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0] ==
                        (puVar6->super_base_blob<256U>).m_data._M_elems[0]);
          auVar23[1] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[1] ==
                        (puVar6->super_base_blob<256U>).m_data._M_elems[1]);
          auVar23[2] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[2] ==
                        (puVar6->super_base_blob<256U>).m_data._M_elems[2]);
          auVar23[3] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[3] ==
                        (puVar6->super_base_blob<256U>).m_data._M_elems[3]);
          auVar23[4] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] ==
                        (puVar6->super_base_blob<256U>).m_data._M_elems[4]);
          auVar23[5] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[5] ==
                        (puVar6->super_base_blob<256U>).m_data._M_elems[5]);
          auVar23[6] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[6] ==
                        (puVar6->super_base_blob<256U>).m_data._M_elems[6]);
          auVar23[7] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[7] ==
                        (puVar6->super_base_blob<256U>).m_data._M_elems[7]);
          auVar23[8] = -((bool)result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[8] ==
                        bStack_670);
          auVar23[9] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[9] ==
                        uStack_66f);
          auVar23[10] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[10] ==
                         uStack_66e);
          auVar23[0xb] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xb] ==
                          uStack_66d);
          auVar23[0xc] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xc] ==
                          uStack_66c);
          auVar23[0xd] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xd] ==
                          uStack_66b);
          auVar23[0xe] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xe] ==
                          uStack_66a);
          auVar23[0xf] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xf] ==
                          uStack_669);
          auVar23 = auVar23 & auVar27;
          local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff);
          local_780.m_message.px = (element_type *)0x0;
          local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_790 = (ScanResult *)0xf86b3c;
          local_788 = "";
          local_7c0 = &result.last_scanned_block;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ac618;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_7e8 = (undefined1  [8])local_678;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 0x18;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._1_7_ = 0x13ac6;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          pvVar18 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_780,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf86caf,(size_t)&local_790,
                     0x80,(lazy_ostream *)&locator,"newTip->GetBlockHash()",&locator_1);
          boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
          local_9d8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_9d0 = "";
          local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_09.m_end = (iterator)0x81;
          file_09.m_begin = (iterator)&local_9d8;
          msg_09.m_end = pvVar21;
          msg_09.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                     (size_t)&local_9e8,msg_09);
          local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
          local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
          local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_7c8 = "";
          local_678[0] = result.last_scanned_height.super__Optional_base<int,_true,_true>._M_payload
                         .super__Optional_payload_base<int>._M_payload._M_value == pCVar32->nHeight;
          piVar1 = &pCVar32->nHeight;
          bStack_670 = false;
          uStack_66f = '\0';
          uStack_66e = '\0';
          uStack_66d = '\0';
          uStack_66c = '\0';
          uStack_66b = '\0';
          uStack_66a = '\0';
          uStack_669 = '\0';
          sStack_668.pi_ = (sp_counted_base *)0x0;
          local_780._0_8_ =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_780.m_message.px = (element_type *)0xf86ba8;
          local_790 = (ScanResult *)&result.last_scanned_height;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abcf0;
          paStack_690 = (assertion_result *)&local_790;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 0xf0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._1_7_ = 0x13abc;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          pvVar18 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          local_7c0 = (uint256 *)piVar1;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf86ce0,
                     (size_t)&local_780,0x81,(lazy_ostream *)&locator,"newTip->nHeight",&locator_1);
          boost::detail::shared_count::~shared_count(&sStack_668);
          local_9f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_9f0 = "";
          local_a10.m_message.px =
               (element_type *)&boost::unit_test::basic_cstring<char_const>::null;
          local_a10.m_message.pn.pi_ =
               (sp_counted_base *)&boost::unit_test::basic_cstring<char_const>::null;
          file_10.m_end = (iterator)0x82;
          file_10.m_begin = (iterator)&local_9f8;
          msg_10.m_end = pvVar21;
          msg_10.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                     (size_t)&local_a10.m_message,msg_10);
          bStack_670 = false;
          local_678 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
          sStack_668.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          pcStack_660 = "";
          GetBalance((Balance *)&locator,&wallet,0,true);
          local_7e8 = (undefined1  [8])&local_a10;
          local_a10.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)0x0;
          local_a10._1_7_ = 0x2540be4;
          local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == (pointer)0x2540be400);
          local_780.m_message.px = (element_type *)0x0;
          local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_790 = (ScanResult *)0xf86b3c;
          local_788 = "";
          local_7c0 = (uint256 *)
                      &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 0xd0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._1_7_ = 0x13abe;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
          local_7e0._0_8_ = &PTR__lazy_ostream_013abed0;
          local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_7c8 = local_7e8;
          pvVar18 = (iterator)0x1;
          pvVar21 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_780,(lazy_ostream *)local_678,1,2,REQUIRE,0xf86c52,(size_t)&local_790,
                     0x82,&locator_1,"100 * COIN",&local_7e0);
          boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._1_7_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._1_7_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a20 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_a18 = "";
          local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
          local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
          file_11.m_end = (iterator)0x86;
          file_11.m_begin = (iterator)&local_a20;
          msg_11.m_end = pvVar21;
          msg_11.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                     (size_t)&local_a30,msg_11);
          if ((__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
              )wallet.m_database._M_t.
               super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
               ._M_t.
               super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
               .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
              )0x0) goto LAB_00809f76;
          pCVar22 = pCVar33;
          (**(code **)(*(long *)wallet.m_database._M_t.
                                super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                                .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl
                      + 0x70))
                    (local_678,
                     wallet.m_database._M_t.
                     super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                     .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl,1);
          bStack_670 = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._0_1_;
          uStack_66f = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._1_1_;
          uStack_66e = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._2_1_;
          uStack_66d = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._3_1_;
          uStack_66c = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._4_1_;
          uStack_66b = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._5_1_;
          uStack_66a = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._6_1_;
          uStack_669 = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._7_1_;
          _cVar34 = 0x808960;
          rVar12.super_readonly_property<bool>.super_class_property<bool>.value =
               (readonly_property<bool>)
               WalletBatch::ReadBestBlock((WalletBatch *)local_678,&locator_1);
          local_7e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = rVar12.super_readonly_property<bool>.super_class_property<bool>.value;
          local_7e0.m_message.px = (element_type *)0x0;
          local_7e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_780._0_8_ = "WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator)";
          local_780.m_message.px = (element_type *)0xf86cae;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
          paStack_690 = &local_780;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_a40 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_a38 = "";
          pvVar18 = (iterator)0x1;
          pvVar21 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_7e0,(lazy_ostream *)&locator,1,0,WARN,_cVar34,(size_t)&local_a40,0x86);
          boost::detail::shared_count::~shared_count(&local_7e0.m_message.pn);
          if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
               )local_678 != (DatabaseBatch *)0x0) {
            (*(*(_func_int ***)local_678)[5])();
          }
          local_a50 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_a48 = "";
          local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
          local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
          _cVar34 = 0x808a48;
          file_12.m_end = (iterator)0x87;
          file_12.m_begin = (iterator)&local_a50;
          msg_12.m_end = pvVar21;
          msg_12.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                     (size_t)&local_a60,msg_12);
          local_7e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           (byte)locator_1.vHave.
                                 super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                 super__Vector_impl_data._M_start) !=
                 CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_finish._1_7_,
                          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_finish._0_1_));
          local_7e0.m_message.px = (element_type *)0x0;
          local_7e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_678 = (undefined1  [8])0xf86d17;
          bStack_670 = true;
          uStack_66f = 'm';
          uStack_66e = 0xf8;
          uStack_66d = '\0';
          uStack_66c = '\0';
          uStack_66b = '\0';
          uStack_66a = '\0';
          uStack_669 = '\0';
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
          paStack_690 = (assertion_result *)local_678;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_a70 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_a68 = "";
          boost::test_tools::tt_detail::report_assertion
                    (&local_7e0,(lazy_ostream *)&locator,1,0,WARN,_cVar34,(size_t)&local_a70,0x87);
          boost::detail::shared_count::~shared_count(&local_7e0.m_message.pn);
          pvVar8 = (void *)CONCAT71(locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_start._1_7_,
                                    (byte)locator_1.vHave.
                                          super__Vector_base<uint256,_std::allocator<uint256>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
          val = puVar31;
          if (pvVar8 != (void *)0x0) {
            operator_delete(pvVar8,(long)locator_1.vHave.
                                         super__Vector_base<uint256,_std::allocator<uint256>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar8);
          }
          WalletRescanReserver::~WalletRescanReserver(&reserver);
          CWallet::~CWallet(&wallet);
          wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
          wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
          std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&wallet)
          ;
          aVar17 = -(uint)((pCVar33->nStatus & 8) == 0) | pCVar33->nFile;
          puVar16 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                              (puVar31,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                               ,0x90,"test_method","m_node.chainman");
          ::node::BlockManager::PruneOneBlockFile
                    (&((puVar16->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman,
                     aVar17);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&wallet);
          pCVar7 = (puVar31->_M_t).
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
          result.status = aVar17;
          __l._M_len = 1;
          __l._M_array = (iterator)&result;
          std::set<int,_std::less<int>,_std::allocator<int>_>::set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&wallet,__l,
                     (less<int> *)&reserver,(allocator_type *)&locator);
          ::node::BlockManager::UnlinkPrunedFiles
                    (&pCVar7->m_blockman,(set<int,_std::less<int>,_std::allocator<int>_> *)&wallet);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&wallet);
          pCVar4 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                   super_BasicTestingSetup.m_node.chain._M_t.
                   super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                   .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
          result._0_8_ = result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc;
          std::__cxx11::string::_M_construct<char_const*>((string *)&result,"","");
          local_708 = (undefined1  [16])0x0;
          local_6f8._8_8_ = 0;
          local_6f8._0_8_ = local_708 + 8;
          local_6f8 = local_6f8 << 0x40;
          local_6e8._8_8_ = 0;
          local_6e8._0_8_ = local_708 + 8;
          records_01._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = val;
          records_01._M_t._M_impl._0_8_ = in_stack_fffffffffffff3e8;
          records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pCVar32;
          records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this;
          records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pCVar22;
          records_01._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00;
          CreateMockableWalletDatabase((wallet *)&local_a78,records_01);
          CWallet::CWallet(&wallet,pCVar4,(string *)&result,
                           (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                            )&local_a78);
          if (local_a78 != (long *)0x0) {
            (**(code **)(*local_a78 + 8))();
          }
          local_a78 = (long *)0x0;
          std::
          _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                       *)local_708);
          if ((uchar *)result._0_8_ !=
              result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc) {
            operator_delete((void *)result._0_8_,
                            result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ +
                            1);
          }
          result._0_8_ = &wallet.cs_wallet;
          result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&result)
          ;
          inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                    (val,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                     ,0x9a,"test_method","m_node.chainman");
          reserver._0_9_ = ZEXT89(0x13bf540);
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)&reserver);
          CWallet::SetWalletFlag(&wallet,0x400000000);
          pCVar13 = ChainstateManager::ActiveChainstate
                              ((val->_M_t).
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
          ppCVar3 = (pCVar13->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppCVar5 = (pCVar13->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar13 = ChainstateManager::ActiveChainstate
                              ((val->_M_t).
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
          puVar6 = (pCVar13->m_chain).vChain.
                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1]->phashBlock;
          if (puVar6 != (uint256 *)0x0) {
            wallet.m_last_block_processed_height =
                 (int)((ulong)((long)ppCVar3 - (long)ppCVar5) >> 3) + -1;
            wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)(puVar6->super_base_blob<256U>).m_data._M_elems;
            wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
            wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
            wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&reserver);
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&result);
            AddKey(&wallet,this_00);
            reserver.m_could_reserve = false;
            reserver.m_wallet = &wallet;
            reserver.m_now.super__Function_base._M_functor = (_Any_data)0x0;
            reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
            reserver.m_now._M_invoker = (_Invoker_type)0x0;
            WalletRescanReserver::reserve(&reserver,false);
            puVar6 = pCVar33->phashBlock;
            if (puVar6 != (uint256 *)0x0) {
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._0_16_ =
                   *(undefined1 (*) [16])(puVar6->super_base_blob<256U>).m_data._M_elems;
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
              pWVar20 = &reserver;
              pvVar18 = (iterator)0x0;
              CWallet::ScanForWalletTransactions
                        (&result,&wallet,(uint256 *)&locator,pCVar33->nHeight,(optional<int>)0x0,
                         pWVar20,false,false);
              local_a88 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
              ;
              local_a80 = "";
              local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
              local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
              file_13.m_end = (iterator)0xa2;
              file_13.m_begin = (iterator)&local_a88;
              msg_13.m_end = (iterator)pWVar20;
              msg_13.m_begin = pvVar18;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                         (size_t)&local_a98,msg_13);
              local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
              local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
              local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_7c8 = "";
              local_678[0] = result.status == FAILURE;
              local_7e8._0_4_ = 1;
              bStack_670 = false;
              uStack_66f = '\0';
              uStack_66e = '\0';
              uStack_66d = '\0';
              uStack_66c = '\0';
              uStack_66b = '\0';
              uStack_66a = '\0';
              uStack_669 = '\0';
              sStack_668.pi_ = (sp_counted_base *)0x0;
              local_780._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
              ;
              local_780.m_message.px = (element_type *)0xf86ba8;
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = 0;
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013b2fb8;
              paStack_690 = (assertion_result *)&local_790;
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)boost::unit_test::lazy_ostream::inst;
              local_7c0 = (uint256 *)local_7e8;
              locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = 0;
              locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start._0_1_ = 0xb8;
              locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start._1_7_ = 0x13b2f;
              locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)boost::unit_test::lazy_ostream::inst;
              pvVar18 = (iterator)0x1;
              pvVar21 = (iterator)0x2;
              local_790 = &result;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,
                         0xf86bc6,(size_t)&local_780,0xa2,(uint256 *)&locator,
                         "CWallet::ScanResult::FAILURE",&locator_1);
              boost::detail::shared_count::~shared_count(&sStack_668);
              local_aa8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
              ;
              local_aa0 = "";
              local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_14.m_end = (iterator)0xa3;
              file_14.m_begin = (iterator)&local_aa8;
              msg_14.m_end = pvVar21;
              msg_14.m_begin = pvVar18;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                         (size_t)&local_ab8,msg_14);
              local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
              local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
              local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_7c8 = "";
              puVar6 = pCVar22->phashBlock;
              if (puVar6 != (uint256 *)0x0) {
                local_678 = *(undefined1 (*) [8])(puVar6->super_base_blob<256U>).m_data._M_elems;
                bStack_670 = (bool)(puVar6->super_base_blob<256U>).m_data._M_elems[8];
                uStack_66f = (puVar6->super_base_blob<256U>).m_data._M_elems[9];
                uStack_66e = (puVar6->super_base_blob<256U>).m_data._M_elems[10];
                uStack_66d = (puVar6->super_base_blob<256U>).m_data._M_elems[0xb];
                uStack_66c = (puVar6->super_base_blob<256U>).m_data._M_elems[0xc];
                uStack_66b = (puVar6->super_base_blob<256U>).m_data._M_elems[0xd];
                uStack_66a = (puVar6->super_base_blob<256U>).m_data._M_elems[0xe];
                uStack_669 = (puVar6->super_base_blob<256U>).m_data._M_elems[0xf];
                auVar2 = *(undefined1 (*) [16])
                          ((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
                sStack_668.pi_ = auVar2._0_8_;
                pcStack_660 = auVar2._8_8_;
                auVar28[0] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x10]
                              == auVar2[0]);
                auVar28[1] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x11]
                              == auVar2[1]);
                auVar28[2] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x12]
                              == auVar2[2]);
                auVar28[3] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x13]
                              == auVar2[3]);
                auVar28[4] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x14]
                              == auVar2[4]);
                auVar28[5] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x15]
                              == auVar2[5]);
                auVar28[6] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x16]
                              == auVar2[6]);
                auVar28[7] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x17]
                              == auVar2[7]);
                auVar28[8] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x18]
                              == auVar2[8]);
                auVar28[9] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x19]
                              == auVar2[9]);
                auVar28[10] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x1a]
                               == auVar2[10]);
                auVar28[0xb] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1b] == auVar2[0xb]);
                auVar28[0xc] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1c] == auVar2[0xc]);
                auVar28[0xd] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1d] == auVar2[0xd]);
                auVar28[0xe] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1e] == auVar2[0xe]);
                auVar28[0xf] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1f] == auVar2[0xf]);
                auVar24[0] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0] ==
                              (puVar6->super_base_blob<256U>).m_data._M_elems[0]);
                auVar24[1] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[1] ==
                              (puVar6->super_base_blob<256U>).m_data._M_elems[1]);
                auVar24[2] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[2] ==
                              (puVar6->super_base_blob<256U>).m_data._M_elems[2]);
                auVar24[3] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[3] ==
                              (puVar6->super_base_blob<256U>).m_data._M_elems[3]);
                auVar24[4] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[4] ==
                              (puVar6->super_base_blob<256U>).m_data._M_elems[4]);
                auVar24[5] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[5] ==
                              (puVar6->super_base_blob<256U>).m_data._M_elems[5]);
                auVar24[6] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[6] ==
                              (puVar6->super_base_blob<256U>).m_data._M_elems[6]);
                auVar24[7] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[7] ==
                              (puVar6->super_base_blob<256U>).m_data._M_elems[7]);
                auVar24[8] = -((bool)result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                     [8] == bStack_670);
                auVar24[9] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[9] ==
                              uStack_66f);
                auVar24[10] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[10]
                               == uStack_66e);
                auVar24[0xb] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xb]
                                == uStack_66d);
                auVar24[0xc] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xc]
                                == uStack_66c);
                auVar24[0xd] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xd]
                                == uStack_66b);
                auVar24[0xe] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xe]
                                == uStack_66a);
                auVar24[0xf] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xf]
                                == uStack_669);
                auVar24 = auVar24 & auVar28;
                local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)
                         (readonly_property<bool>)
                         ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff);
                local_780.m_message.px = (element_type *)0x0;
                local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_790 = (ScanResult *)0xf86b3c;
                local_788 = "";
                local_7c0 = &result.last_failed_block;
                locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_ = 0;
                locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ac618;
                paStack_690 = (assertion_result *)&local_7c0;
                locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)boost::unit_test::lazy_ostream::inst;
                locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_ = 0;
                locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start._0_1_ = 0x18;
                locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start._1_7_ = 0x13ac6;
                locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)boost::unit_test::lazy_ostream::inst;
                pvVar18 = (iterator)0x1;
                pvVar21 = (iterator)0x2;
                local_7e8 = (undefined1  [8])local_678;
                boost::test_tools::tt_detail::report_assertion
                          (&local_780,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf86d29,
                           (size_t)&local_790,0xa3,(uint256 *)&locator,"oldTip->GetBlockHash()",
                           &locator_1);
                boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                local_ac8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                ;
                local_ac0 = "";
                local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
                file_15.m_end = (iterator)0xa4;
                file_15.m_begin = (iterator)&local_ac8;
                msg_15.m_end = pvVar21;
                msg_15.m_begin = pvVar18;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                           (size_t)&local_ad8,msg_15);
                local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
                local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_7c8 = "";
                puVar6 = pCVar32->phashBlock;
                if (puVar6 != (uint256 *)0x0) {
                  local_678 = *(undefined1 (*) [8])(puVar6->super_base_blob<256U>).m_data._M_elems;
                  bStack_670 = (bool)(puVar6->super_base_blob<256U>).m_data._M_elems[8];
                  uStack_66f = (puVar6->super_base_blob<256U>).m_data._M_elems[9];
                  uStack_66e = (puVar6->super_base_blob<256U>).m_data._M_elems[10];
                  uStack_66d = (puVar6->super_base_blob<256U>).m_data._M_elems[0xb];
                  uStack_66c = (puVar6->super_base_blob<256U>).m_data._M_elems[0xc];
                  uStack_66b = (puVar6->super_base_blob<256U>).m_data._M_elems[0xd];
                  uStack_66a = (puVar6->super_base_blob<256U>).m_data._M_elems[0xe];
                  uStack_669 = (puVar6->super_base_blob<256U>).m_data._M_elems[0xf];
                  auVar2 = *(undefined1 (*) [16])
                            ((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
                  sStack_668.pi_ = auVar2._0_8_;
                  pcStack_660 = auVar2._8_8_;
                  auVar29[0] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x10] == auVar2[0]);
                  auVar29[1] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x11] == auVar2[1]);
                  auVar29[2] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x12] == auVar2[2]);
                  auVar29[3] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x13] == auVar2[3]);
                  auVar29[4] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x14] == auVar2[4]);
                  auVar29[5] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x15] == auVar2[5]);
                  auVar29[6] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x16] == auVar2[6]);
                  auVar29[7] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x17] == auVar2[7]);
                  auVar29[8] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x18] == auVar2[8]);
                  auVar29[9] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x19] == auVar2[9]);
                  auVar29[10] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                  [0x1a] == auVar2[10]);
                  auVar29[0xb] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1b] == auVar2[0xb]);
                  auVar29[0xc] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1c] == auVar2[0xc]);
                  auVar29[0xd] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1d] == auVar2[0xd]);
                  auVar29[0xe] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1e] == auVar2[0xe]);
                  auVar29[0xf] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1f] == auVar2[0xf]);
                  auVar25[0] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0]
                                == (puVar6->super_base_blob<256U>).m_data._M_elems[0]);
                  auVar25[1] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[1]
                                == (puVar6->super_base_blob<256U>).m_data._M_elems[1]);
                  auVar25[2] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[2]
                                == (puVar6->super_base_blob<256U>).m_data._M_elems[2]);
                  auVar25[3] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[3]
                                == (puVar6->super_base_blob<256U>).m_data._M_elems[3]);
                  auVar25[4] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4]
                                == (puVar6->super_base_blob<256U>).m_data._M_elems[4]);
                  auVar25[5] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[5]
                                == (puVar6->super_base_blob<256U>).m_data._M_elems[5]);
                  auVar25[6] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[6]
                                == (puVar6->super_base_blob<256U>).m_data._M_elems[6]);
                  auVar25[7] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[7]
                                == (puVar6->super_base_blob<256U>).m_data._M_elems[7]);
                  auVar25[8] = -((bool)result.last_scanned_block.super_base_blob<256U>.m_data.
                                       _M_elems[8] == bStack_670);
                  auVar25[9] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[9]
                                == uStack_66f);
                  auVar25[10] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                  [10] == uStack_66e);
                  auVar25[0xb] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xb] == uStack_66d);
                  auVar25[0xc] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xc] == uStack_66c);
                  auVar25[0xd] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xd] == uStack_66b);
                  auVar25[0xe] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xe] == uStack_66a);
                  auVar25[0xf] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xf] == uStack_669);
                  auVar25 = auVar25 & auVar29;
                  local_780.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)
                       (readonly_property<bool>)
                       ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff);
                  local_780.m_message.px = (element_type *)0x0;
                  local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_790 = (ScanResult *)0xf86b3c;
                  local_788 = "";
                  local_7c0 = &result.last_scanned_block;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ac618;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ = 0x18;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._1_7_ = 0x13ac6;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  pvVar18 = (iterator)0x1;
                  pvVar21 = (iterator)0x2;
                  local_7e8 = (undefined1  [8])local_678;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_780,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf86caf,
                             (size_t)&local_790,0xa4,(uint256 *)&locator,"newTip->GetBlockHash()",
                             &locator_1);
                  boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                  local_ae8 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ;
                  local_ae0 = "";
                  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_16.m_end = (iterator)0xa5;
                  file_16.m_begin = (iterator)&local_ae8;
                  msg_16.m_end = pvVar21;
                  msg_16.m_begin = pvVar18;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                             (size_t)&local_af8,msg_16);
                  local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                  local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
                  local_7e0.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_7c8 = "";
                  local_678[0] = result.last_scanned_height.super__Optional_base<int,_true,_true>.
                                 _M_payload.super__Optional_payload_base<int>._M_payload._M_value ==
                                 *piVar1;
                  bStack_670 = false;
                  uStack_66f = '\0';
                  uStack_66e = '\0';
                  uStack_66d = '\0';
                  uStack_66c = '\0';
                  uStack_66b = '\0';
                  uStack_66a = '\0';
                  uStack_669 = '\0';
                  sStack_668.pi_ = (sp_counted_base *)0x0;
                  local_780._0_8_ =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ;
                  local_780.m_message.px = (element_type *)0xf86ba8;
                  local_790 = (ScanResult *)&result.last_scanned_height;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abcf0;
                  paStack_690 = (assertion_result *)&local_790;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ = 0xf0;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._1_7_ = 0x13abc;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  pvVar18 = (iterator)0x1;
                  pvVar21 = (iterator)0x2;
                  local_7c0 = (uint256 *)piVar1;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,
                             0xf86ce0,(size_t)&local_780,0xa5,(uint256 *)&locator,"newTip->nHeight",
                             &locator_1);
                  boost::detail::shared_count::~shared_count(&sStack_668);
                  local_b08 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ;
                  local_b00 = "";
                  local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_17.m_end = (iterator)0xa6;
                  file_17.m_begin = (iterator)&local_b08;
                  msg_17.m_end = pvVar21;
                  msg_17.m_begin = pvVar18;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                             (size_t)&local_b18,msg_17);
                  bStack_670 = false;
                  local_678 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
                  sStack_668.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  pcStack_660 = "";
                  GetBalance((Balance *)&locator,&wallet,0,true);
                  fake_time.__d.__r = (duration)5000000000;
                  local_780.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)
                       (readonly_property<bool>)
                       (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage == (pointer)0x12a05f200);
                  local_780.m_message.px = (element_type *)0x0;
                  local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_790 = (ScanResult *)0xf86b3c;
                  local_788 = "";
                  local_7c0 = (uint256 *)
                              &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ = 0xd0;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._1_7_ = 0x13abe;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  local_7e8 = (undefined1  [8])&fake_time;
                  local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                  local_7e0._0_8_ = &PTR__lazy_ostream_013abed0;
                  local_7e0.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_7c8 = local_7e8;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_780,(lazy_ostream *)local_678,1,2,REQUIRE,0xf86c52,
                             (size_t)&local_790,0xa6,&locator_1,"50 * COIN",&local_7e0);
                  puVar31 = val;
                  boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                  WalletRescanReserver::~WalletRescanReserver(&reserver);
                  CWallet::~CWallet(&wallet);
                  wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
                  wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
                  std::unique_lock<std::recursive_mutex>::lock
                            ((unique_lock<std::recursive_mutex> *)&wallet);
                  aVar17 = -(uint)((pCVar32->nStatus & 8) == 0) | pCVar32->nFile;
                  puVar16 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                                      (val,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                                       ,0xad,"test_method","m_node.chainman");
                  ::node::BlockManager::PruneOneBlockFile
                            (&((puVar16->_M_t).
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                              m_blockman,aVar17);
                  std::unique_lock<std::recursive_mutex>::~unique_lock
                            ((unique_lock<std::recursive_mutex> *)&wallet);
                  pCVar7 = (val->_M_t).
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
                  result.status = aVar17;
                  __l_00._M_len = 1;
                  __l_00._M_array = (iterator)&result;
                  std::set<int,_std::less<int>,_std::allocator<int>_>::set
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)&wallet,__l_00,
                             (less<int> *)&reserver,(allocator_type *)&locator);
                  ::node::BlockManager::UnlinkPrunedFiles
                            (&pCVar7->m_blockman,
                             (set<int,_std::less<int>,_std::allocator<int>_> *)&wallet);
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                               *)&wallet);
                  pCVar4 = (this->super_TestChain100Setup).super_TestingSetup.
                           super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
                  result._0_8_ = result.last_scanned_block.super_base_blob<256U>.m_data._M_elems +
                                 0xc;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"");
                  local_738 = (undefined1  [16])0x0;
                  local_728._8_8_ = 0;
                  local_728._0_8_ = local_738 + 8;
                  local_728 = local_728 << 0x40;
                  local_718._8_8_ = 0;
                  local_718._0_8_ = local_738 + 8;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar31;
                  records_02._M_t._M_impl._0_8_ = in_stack_fffffffffffff3e8;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)pCVar32;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       (_Base_ptr)pCVar22;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00;
                  CreateMockableWalletDatabase((wallet *)&local_b20,records_02);
                  CWallet::CWallet(&wallet,pCVar4,(string *)&result,
                                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                    )&local_b20);
                  if (local_b20 != (long *)0x0) {
                    (**(code **)(*local_b20 + 8))();
                  }
                  local_b20 = (long *)0x0;
                  std::
                  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                  ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                               *)local_738);
                  if ((uchar *)result._0_8_ !=
                      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc) {
                    operator_delete((void *)result._0_8_,
                                    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems.
                                    _12_8_ + 1);
                  }
                  result._0_8_ = &wallet.cs_wallet;
                  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
                  std::unique_lock<std::recursive_mutex>::lock
                            ((unique_lock<std::recursive_mutex> *)&result);
                  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                            (val,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                             ,0xb6,"test_method","m_node.chainman");
                  reserver._0_9_ = ZEXT89(0x13bf540);
                  std::unique_lock<std::recursive_mutex>::lock
                            ((unique_lock<std::recursive_mutex> *)&reserver);
                  CWallet::SetWalletFlag(&wallet,0x400000000);
                  pCVar13 = ChainstateManager::ActiveChainstate
                                      ((val->_M_t).
                                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                       .super__Head_base<0UL,_ChainstateManager_*,_false>.
                                       _M_head_impl);
                  ppCVar3 = (pCVar13->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  ppCVar5 = (pCVar13->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pCVar13 = ChainstateManager::ActiveChainstate
                                      ((val->_M_t).
                                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                       .super__Head_base<0UL,_ChainstateManager_*,_false>.
                                       _M_head_impl);
                  puVar6 = (pCVar13->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish[-1]->phashBlock;
                  if (puVar6 != (uint256 *)0x0) {
                    wallet.m_last_block_processed_height =
                         (int)((ulong)((long)ppCVar3 - (long)ppCVar5) >> 3) + -1;
                    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._0_8_ =
                         *(undefined8 *)(puVar6->super_base_blob<256U>).m_data._M_elems;
                    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._8_8_ =
                         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
                    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._16_8_ =
                         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
                    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._24_8_ =
                         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
                    std::unique_lock<std::recursive_mutex>::~unique_lock
                              ((unique_lock<std::recursive_mutex> *)&reserver);
                    std::unique_lock<std::recursive_mutex>::~unique_lock
                              ((unique_lock<std::recursive_mutex> *)&result);
                    AddKey(&wallet,this_00);
                    reserver.m_could_reserve = false;
                    reserver.m_wallet = &wallet;
                    reserver.m_now.super__Function_base._M_functor = (_Any_data)0x0;
                    reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
                    reserver.m_now._M_invoker = (_Invoker_type)0x0;
                    WalletRescanReserver::reserve(&reserver,false);
                    puVar6 = pCVar22->phashBlock;
                    if (puVar6 != (uint256 *)0x0) {
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._0_16_ =
                           *(undefined1 (*) [16])(puVar6->super_base_blob<256U>).m_data._M_elems;
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           *(pointer *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
                      pWVar20 = &reserver;
                      pvVar18 = (iterator)0x0;
                      CWallet::ScanForWalletTransactions
                                (&result,&wallet,(uint256 *)&locator,pCVar22->nHeight,
                                 (optional<int>)0x0,pWVar20,false,false);
                      local_b30 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                      ;
                      local_b28 = "";
                      local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
                      file_18.m_end = (iterator)0xbe;
                      file_18.m_begin = (iterator)&local_b30;
                      msg_18.m_end = (iterator)pWVar20;
                      msg_18.m_begin = pvVar18;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                                 (size_t)&local_b40,msg_18);
                      local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                      local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
                      local_7e0.m_message.pn.pi_ =
                           (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      local_7c8 = "";
                      local_678[0] = result.status == FAILURE;
                      local_7e8._0_4_ = 1;
                      bStack_670 = false;
                      uStack_66f = '\0';
                      uStack_66e = '\0';
                      uStack_66d = '\0';
                      uStack_66c = '\0';
                      uStack_66b = '\0';
                      uStack_66a = '\0';
                      uStack_669 = '\0';
                      sStack_668.pi_ = (sp_counted_base *)0x0;
                      local_780._0_8_ =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                      ;
                      local_780.m_message.px = (element_type *)0xf86ba8;
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_1_ = 0;
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013b2fb8;
                      paStack_690 = (assertion_result *)&local_790;
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           (pointer)boost::unit_test::lazy_ostream::inst;
                      local_7c0 = (uint256 *)local_7e8;
                      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_1_ = 0;
                      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start._0_1_ = 0xb8;
                      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start._1_7_ = 0x13b2f;
                      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           (pointer)boost::unit_test::lazy_ostream::inst;
                      pvVar18 = (iterator)0x1;
                      pvVar21 = (iterator)0x2;
                      local_790 = &result;
                      boost::test_tools::tt_detail::report_assertion
                                ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,
                                 REQUIRE,0xf86bc6,(size_t)&local_780,0xbe,(uint256 *)&locator,
                                 "CWallet::ScanResult::FAILURE",&locator_1);
                      boost::detail::shared_count::~shared_count(&sStack_668);
                      local_b50 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                      ;
                      local_b48 = "";
                      local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
                      file_19.m_end = (iterator)0xbf;
                      file_19.m_begin = (iterator)&local_b50;
                      msg_19.m_end = pvVar21;
                      msg_19.m_begin = pvVar18;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                                 (size_t)&local_b60,msg_19);
                      local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                      local_7e0._0_8_ = &PTR__lazy_ostream_013abb30;
                      local_7e0.m_message.pn.pi_ =
                           (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      local_7c8 = "";
                      puVar6 = pCVar32->phashBlock;
                      if (puVar6 != (uint256 *)0x0) {
                        local_678 = *(undefined1 (*) [8])
                                     (puVar6->super_base_blob<256U>).m_data._M_elems;
                        bStack_670 = (bool)(puVar6->super_base_blob<256U>).m_data._M_elems[8];
                        uStack_66f = (puVar6->super_base_blob<256U>).m_data._M_elems[9];
                        uStack_66e = (puVar6->super_base_blob<256U>).m_data._M_elems[10];
                        uStack_66d = (puVar6->super_base_blob<256U>).m_data._M_elems[0xb];
                        uStack_66c = (puVar6->super_base_blob<256U>).m_data._M_elems[0xc];
                        uStack_66b = (puVar6->super_base_blob<256U>).m_data._M_elems[0xd];
                        uStack_66a = (puVar6->super_base_blob<256U>).m_data._M_elems[0xe];
                        uStack_669 = (puVar6->super_base_blob<256U>).m_data._M_elems[0xf];
                        auVar2 = *(undefined1 (*) [16])
                                  ((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
                        sStack_668.pi_ = auVar2._0_8_;
                        pcStack_660 = auVar2._8_8_;
                        auVar30[0] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x10] == auVar2[0]);
                        auVar30[1] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x11] == auVar2[1]);
                        auVar30[2] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x12] == auVar2[2]);
                        auVar30[3] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x13] == auVar2[3]);
                        auVar30[4] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x14] == auVar2[4]);
                        auVar30[5] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x15] == auVar2[5]);
                        auVar30[6] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x16] == auVar2[6]);
                        auVar30[7] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x17] == auVar2[7]);
                        auVar30[8] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x18] == auVar2[8]);
                        auVar30[9] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x19] == auVar2[9]);
                        auVar30[10] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                        _M_elems[0x1a] == auVar2[10]);
                        auVar30[0xb] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1b] == auVar2[0xb]);
                        auVar30[0xc] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1c] == auVar2[0xc]);
                        auVar30[0xd] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1d] == auVar2[0xd]);
                        auVar30[0xe] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1e] == auVar2[0xe]);
                        auVar30[0xf] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1f] == auVar2[0xf]);
                        auVar26[0] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0] ==
                                      (puVar6->super_base_blob<256U>).m_data._M_elems[0]);
                        auVar26[1] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[1] ==
                                      (puVar6->super_base_blob<256U>).m_data._M_elems[1]);
                        auVar26[2] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[2] ==
                                      (puVar6->super_base_blob<256U>).m_data._M_elems[2]);
                        auVar26[3] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[3] ==
                                      (puVar6->super_base_blob<256U>).m_data._M_elems[3]);
                        auVar26[4] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[4] ==
                                      (puVar6->super_base_blob<256U>).m_data._M_elems[4]);
                        auVar26[5] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[5] ==
                                      (puVar6->super_base_blob<256U>).m_data._M_elems[5]);
                        auVar26[6] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[6] ==
                                      (puVar6->super_base_blob<256U>).m_data._M_elems[6]);
                        auVar26[7] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[7] ==
                                      (puVar6->super_base_blob<256U>).m_data._M_elems[7]);
                        auVar26[8] = -((bool)result.last_failed_block.super_base_blob<256U>.m_data.
                                             _M_elems[8] == bStack_670);
                        auVar26[9] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[9] == uStack_66f);
                        auVar26[10] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                        _M_elems[10] == uStack_66e);
                        auVar26[0xb] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xb] == uStack_66d);
                        auVar26[0xc] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xc] == uStack_66c);
                        auVar26[0xd] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xd] == uStack_66b);
                        auVar26[0xe] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xe] == uStack_66a);
                        auVar26[0xf] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xf] == uStack_669);
                        auVar26 = auVar26 & auVar30;
                        local_780.m_message.px = (element_type *)0x0;
                        local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_790 = (ScanResult *)0xf86b3c;
                        local_788 = "";
                        local_7c0 = &result.last_failed_block;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ac618;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_ = 0x18;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_7_ = 0x13ac6;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        pvVar18 = (iterator)0x1;
                        pvVar21 = (iterator)0x2;
                        local_7e8 = (undefined1  [8])local_678;
                        local_780.p_predicate_value.super_readonly_property<bool>.
                        super_class_property<bool>.value =
                             (readonly_property<bool>)
                             (readonly_property<bool>)
                             ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff);
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_780,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf86d29,
                                   (size_t)&local_790,0xbf,(uint256 *)&locator,
                                   "newTip->GetBlockHash()",&locator_1);
                        boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                        local_b70 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_b68 = "";
                        local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_20.m_end = (iterator)0xc0;
                        file_20.m_begin = (iterator)&local_b70;
                        msg_20.m_end = pvVar21;
                        msg_20.m_begin = pvVar18;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                                   (size_t)&local_b80,msg_20);
                        _cVar34 = 0x809c36;
                        puVar15 = std::
                                  __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                            (&result.last_scanned_block,&result.last_scanned_height)
                        ;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_ =
                             (optional<int> *)puVar15 == &result.last_scanned_height;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_7e0._0_8_ = "result.last_scanned_block.IsNull()";
                        local_7e0.m_message.px = (element_type *)0xf86c35;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        local_b90 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_b88 = "";
                        pvVar18 = (iterator)0x1;
                        pvVar21 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,
                                   _cVar34,(size_t)&local_b90,0xc0);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)
                                   &locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
                        local_ba0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_b98 = "";
                        local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
                        _cVar34 = 0x809d02;
                        file_21.m_end = (iterator)0xc1;
                        file_21.m_begin = (iterator)&local_ba0;
                        msg_21.m_end = pvVar21;
                        msg_21.m_begin = pvVar18;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                                   (size_t)&local_bb0,msg_21);
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_ =
                             result.last_scanned_height.super__Optional_base<int,_true,_true>.
                             _M_payload.super__Optional_payload_base<int>._M_engaged ^ 1;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_7e0._0_8_ = "!result.last_scanned_height";
                        local_7e0.m_message.px = (element_type *)0xf86c51;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
                        paStack_690 = &local_7e0;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        local_bc0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_bb8 = "";
                        pvVar18 = (iterator)0x1;
                        pvVar21 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,
                                   _cVar34,(size_t)&local_bc0,0xc1);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)
                                   &locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
                        local_bd0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_bc8 = "";
                        local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_22.m_end = (iterator)0xc2;
                        file_22.m_begin = (iterator)&local_bd0;
                        msg_22.m_end = pvVar21;
                        msg_22.m_begin = pvVar18;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                                   (size_t)&local_be0,msg_22);
                        bStack_670 = false;
                        local_678 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
                        sStack_668.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                        pcStack_660 = "";
                        GetBalance((Balance *)&locator,&wallet,0,true);
                        fake_time.__d.__r =
                             (duration)((ulong)fake_time.__d.__r & 0xffffffff00000000);
                        local_780.p_predicate_value.super_readonly_property<bool>.
                        super_class_property<bool>.value =
                             (readonly_property<bool>)
                             (readonly_property<bool>)
                             (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0);
                        local_780.m_message.px = (element_type *)0x0;
                        local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_790 = (ScanResult *)0xf86b3c;
                        local_788 = "";
                        local_7c0 = (uint256 *)
                                    &locator.vHave.
                                     super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_ = 0xd0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_7_ = 0x13abe;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        local_7e8 = (undefined1  [8])&fake_time;
                        local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                        local_7e0._0_8_ = &PTR__lazy_ostream_013abcf0;
                        local_7e0.m_message.pn.pi_ =
                             (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                        local_7c8 = local_7e8;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_780,(lazy_ostream *)local_678,1,2,REQUIRE,0xf86c52,
                                   (size_t)&local_790,0xc2,(assertion_result *)&locator_1,"0",
                                   &local_7e0);
                        boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                        WalletRescanReserver::~WalletRescanReserver(&reserver);
                        CWallet::~CWallet(&wallet);
                        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
                          __stack_chk_fail();
                        }
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(scan_for_wallet_transactions, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    CBlockIndex* oldTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());
    WITH_LOCK(::cs_main, m_node.chainman->m_blockman.GetBlockFileInfo(oldTip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    CBlockIndex* newTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());

    // Verify ScanForWalletTransactions fails to read an unknown start block.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/{}, /*start_height=*/0, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK(result.last_failed_block.IsNull());
        BOOST_CHECK(result.last_scanned_block.IsNull());
        BOOST_CHECK(!result.last_scanned_height);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 0);
    }

    // Verify ScanForWalletTransactions picks up transactions in both the old
    // and new block files.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        std::chrono::steady_clock::time_point fake_time;
        reserver.setNow([&] { fake_time += 60s; return fake_time; });
        reserver.reserve();

        {
            CBlockLocator locator;
            BOOST_CHECK(!WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator));
            BOOST_CHECK(locator.IsNull());
        }

        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/true);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::SUCCESS);
        BOOST_CHECK(result.last_failed_block.IsNull());
        BOOST_CHECK_EQUAL(result.last_scanned_block, newTip->GetBlockHash());
        BOOST_CHECK_EQUAL(*result.last_scanned_height, newTip->nHeight);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 100 * COIN);

        {
            CBlockLocator locator;
            BOOST_CHECK(WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator));
            BOOST_CHECK(!locator.IsNull());
        }
    }

    // Prune the older block file.
    int file_number;
    {
        LOCK(cs_main);
        file_number = oldTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify ScanForWalletTransactions only picks transactions in the new block
    // file.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK_EQUAL(result.last_failed_block, oldTip->GetBlockHash());
        BOOST_CHECK_EQUAL(result.last_scanned_block, newTip->GetBlockHash());
        BOOST_CHECK_EQUAL(*result.last_scanned_height, newTip->nHeight);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 50 * COIN);
    }

    // Prune the remaining block file.
    {
        LOCK(cs_main);
        file_number = newTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify ScanForWalletTransactions scans no blocks.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK_EQUAL(result.last_failed_block, newTip->GetBlockHash());
        BOOST_CHECK(result.last_scanned_block.IsNull());
        BOOST_CHECK(!result.last_scanned_height);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 0);
    }
}